

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool __thiscall
FlowGraph::CheckIfEarlyExitAndAddEdgeToFinally
          (FlowGraph *this,BranchInstr *leaveInstr,Region *currentRegion,Region *branchTargetRegion,
          Instr **instrPrev,LabelInstr **exitLabel)

{
  code *pcVar1;
  bool bVar2;
  RegionType RVar3;
  Region *pRVar4;
  LabelInstr *pLVar5;
  Instr *this_00;
  BranchInstr *pBVar6;
  undefined4 *puVar7;
  BranchInstr *tryExit;
  Instr *target;
  LabelInstr *leaveTarget;
  BranchInstr *leaveChain;
  bool isEarly;
  LabelInstr **exitLabel_local;
  Instr **instrPrev_local;
  Region *branchTargetRegion_local;
  Region *currentRegion_local;
  BranchInstr *leaveInstr_local;
  FlowGraph *this_local;
  
  bVar2 = SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    (&this->finallyLabelStack->
                      super_SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount>);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    RVar3 = Region::GetType(currentRegion);
    if (RVar3 == RegionTypeTry) {
      pRVar4 = Region::GetMatchingCatchRegion(currentRegion);
      if (pRVar4 == (Region *)0x0) {
        pRVar4 = Region::GetMatchingFinallyRegion(currentRegion,false);
        bVar2 = false;
        if (branchTargetRegion != pRVar4) {
          pRVar4 = Region::GetMatchingFinallyRegion(currentRegion,true);
          bVar2 = branchTargetRegion != pRVar4;
        }
        if (bVar2) {
          bVar2 = DoesExitLabelDominate(this,leaveInstr);
          if (bVar2) {
            this_local._7_1_ = false;
          }
          else {
            pLVar5 = DeleteLeaveChainBlocks(this,leaveInstr,instrPrev);
            *exitLabel = pLVar5;
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        pLVar5 = IR::BranchInstr::GetTarget(leaveInstr);
        this_00 = IR::Instr::GetNextRealInstr(&pLVar5->super_Instr);
        if (this_00->m_opcode == Br) {
          pBVar6 = IR::Instr::AsBranchInstr(this_00);
          *instrPrev = &pBVar6->super_Instr;
          this_local._7_1_ = false;
        }
        else {
          bVar2 = DoesExitLabelDominate(this,leaveInstr);
          if (bVar2) {
            this_local._7_1_ = false;
          }
          else {
            pLVar5 = DeleteLeaveChainBlocks(this,leaveInstr,instrPrev);
            *exitLabel = pLVar5;
            this_local._7_1_ = true;
          }
        }
      }
    }
    else {
      RVar3 = Region::GetType(currentRegion);
      if (RVar3 == RegionTypeCatch) {
        this_local._7_1_ = false;
      }
      else {
        RVar3 = Region::GetType(currentRegion);
        if (RVar3 != RegionTypeFinally) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x96,"(currentRegion->GetType() == RegionTypeFinally)",
                             "currentRegion->GetType() == RegionTypeFinally");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        bVar2 = DoesExitLabelDominate(this,leaveInstr);
        if (bVar2) {
          this_local._7_1_ = false;
        }
        else {
          pLVar5 = DeleteLeaveChainBlocks(this,leaveInstr,instrPrev);
          *exitLabel = pLVar5;
          this_local._7_1_ = true;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FlowGraph::CheckIfEarlyExitAndAddEdgeToFinally(IR::BranchInstr *leaveInstr, Region *currentRegion, Region *branchTargetRegion, IR::Instr * &instrPrev, IR::LabelInstr * &exitLabel)
{
    if (finallyLabelStack->Empty())
    {
        return false;
    }

    if (currentRegion->GetType() == RegionTypeTry)
    {
        if (currentRegion->GetMatchingCatchRegion() == nullptr)
        {
            // try of try-finally
            bool isEarly =
                (branchTargetRegion != currentRegion->GetMatchingFinallyRegion(false) &&
                    branchTargetRegion != currentRegion->GetMatchingFinallyRegion(true));
            if (!isEarly) return false;

            if (DoesExitLabelDominate(leaveInstr)) return false;

            // Cleanup Rest of the Leave chain
            exitLabel = DeleteLeaveChainBlocks(leaveInstr, instrPrev);
            return true;
        }
        // try of try-catch

        IR::BranchInstr *leaveChain = leaveInstr;
        IR::LabelInstr * leaveTarget = leaveChain->GetTarget();
        IR::Instr *target = leaveTarget->GetNextRealInstr();
        if (target->m_opcode == Js::OpCode::Br)
        {
            IR::BranchInstr *tryExit = target->AsBranchInstr();
            instrPrev = tryExit;
            return false;
        }

        if (DoesExitLabelDominate(leaveInstr)) return false;

        // Cleanup Rest of the Leave chain
        exitLabel = DeleteLeaveChainBlocks(leaveInstr, instrPrev);
        return true;
    }
    if (currentRegion->GetType() == RegionTypeCatch)
    {
        // We don't care for early exits in catch blocks, because we bailout anyway
        return false;
    }
    Assert(currentRegion->GetType() == RegionTypeFinally);
    // All Leave's inside Finally region are early exits
    // Since we execute non-excepting Finallys in JIT now, we should convert Leave to Br
    if (DoesExitLabelDominate(leaveInstr)) return false;
    exitLabel = DeleteLeaveChainBlocks(leaveInstr, instrPrev);
    return true;
}